

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::basic_json_parser
          (basic_json_parser<char,_std::allocator<char>_> *this,
          basic_json_decode_options<char> *options,allocator<char> *temp_alloc)

{
  basic_json_decode_options<char> *in_RSI;
  allocator<char> *in_stack_000000d8;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_stack_000000e0;
  basic_json_decode_options<char> *in_stack_000000e8;
  basic_json_parser<char,_std::allocator<char>_> *in_stack_000000f0;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> local_38;
  
  basic_json_decode_options<char>::err_handler(in_RSI);
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            (&local_38,(function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)in_RSI
            );
  basic_json_parser(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)0x1bd0f3);
  return;
}

Assistant:

basic_json_parser(const basic_json_decode_options<char_type>& options, 
                      const TempAllocator& temp_alloc = TempAllocator())
        : basic_json_parser(options, options.err_handler(), temp_alloc)
    {
    }